

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t archive_read_disk_descend(archive *_a)

{
  tree *t_00;
  int iVar1;
  wchar_t wVar2;
  wchar_t magic_test;
  tree *t;
  archive_read_disk *a;
  archive *_a_local;
  
  t_00 = *(tree **)&_a[1].archive_format;
  iVar1 = __archive_check_magic(_a,0xbadb0c5,6,"archive_read_disk_descend");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    wVar2 = archive_read_disk_can_descend(_a);
    if (wVar2 == L'\0') {
      _a_local._4_4_ = L'\0';
    }
    else {
      wVar2 = tree_current_is_physical_dir(t_00);
      if (wVar2 == L'\0') {
        wVar2 = tree_current_is_dir(t_00);
        if (wVar2 != L'\0') {
          tree_push(t_00,t_00->basename,t_00->current_filesystem_id,(t_00->st).st_dev,
                    (t_00->st).st_ino,&t_00->restore_time);
          t_00->stack->flags = t_00->stack->flags | 2;
        }
      }
      else {
        tree_push(t_00,t_00->basename,t_00->current_filesystem_id,(t_00->lst).st_dev,
                  (t_00->lst).st_ino,&t_00->restore_time);
        if (t_00->stack->parent->parent == (tree_entry *)0x0) {
          t_00->stack->flags = t_00->stack->flags | 2;
        }
        else {
          t_00->stack->flags = t_00->stack->flags | 1;
        }
      }
      t_00->descend = 0;
      _a_local._4_4_ = L'\0';
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_disk_descend(struct archive *_a)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	struct tree *t = a->tree;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_HEADER | ARCHIVE_STATE_DATA,
	    "archive_read_disk_descend");

	if (!archive_read_disk_can_descend(_a))
		return (ARCHIVE_OK);

	/*
	 * We must not treat the initial specified path as a physical dir,
	 * because if we do then we will try and ascend out of it by opening
	 * ".." which is (a) wrong and (b) causes spurious permissions errors
	 * if ".." is not readable by us. Instead, treat it as if it were a
	 * symlink. (This uses an extra fd, but it can only happen once at the
	 * top level of a traverse.) But we can't necessarily assume t->st is
	 * valid here (though t->lst is), which complicates the logic a
	 * little.
	 */
	if (tree_current_is_physical_dir(t)) {
		tree_push(t, t->basename, t->current_filesystem_id,
		    t->lst.st_dev, t->lst.st_ino, &t->restore_time);
		if (t->stack->parent->parent != NULL)
			t->stack->flags |= isDir;
		else
			t->stack->flags |= isDirLink;
	} else if (tree_current_is_dir(t)) {
		tree_push(t, t->basename, t->current_filesystem_id,
		    t->st.st_dev, t->st.st_ino, &t->restore_time);
		t->stack->flags |= isDirLink;
	}
	t->descend = 0;
	return (ARCHIVE_OK);
}